

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O0

void __thiscall
booster::locale::impl_icu::calendar_impl::calendar_impl(calendar_impl *this,calendar_impl *other)

{
  Calendar *this_00;
  long in_RSI;
  abstract_calendar *in_RDI;
  Calendar *p;
  
  abstract_calendar::abstract_calendar(in_RDI);
  in_RDI->_vptr_abstract_calendar = (_func_int **)&PTR_clone_002eacc0;
  std::mutex::mutex((mutex *)0x266449);
  std::__cxx11::string::string((string *)(in_RDI + 6));
  hold_ptr<icu_70::Calendar>::hold_ptr((hold_ptr<icu_70::Calendar> *)(in_RDI + 10));
  p = (Calendar *)(in_RDI + 10);
  this_00 = hold_ptr<icu_70::Calendar>::operator->((hold_ptr<icu_70::Calendar> *)(in_RSI + 0x50));
  (**(code **)(*(long *)this_00 + 0x18))();
  hold_ptr<icu_70::Calendar>::reset((hold_ptr<icu_70::Calendar> *)this_00,p);
  std::__cxx11::string::operator=((string *)(in_RDI + 6),(string *)(in_RSI + 0x30));
  return;
}

Assistant:

calendar_impl(calendar_impl const &other)
        {
            calendar_.reset(other.calendar_->clone());
            encoding_ = other.encoding_;
        }